

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O2

void get_msurf_descriptor_inlinedHaarWavelets(integral_image *iimage,interest_point *ipoint)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int i;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int scale;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_register_00001384 [12];
  float local_e0;
  int local_d8;
  float ry;
  float rx;
  long local_c8;
  float local_bc;
  int local_b8;
  float local_b4;
  float local_b0;
  int local_ac;
  float local_a8;
  float local_a4;
  interest_point *local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  ulong local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  
  auVar13._8_4_ = 0x3effffff;
  auVar13._0_8_ = 0x3effffff3effffff;
  auVar13._12_4_ = 0x3effffff;
  auVar16._8_4_ = 0x80000000;
  auVar16._0_8_ = 0x8000000080000000;
  auVar16._12_4_ = 0x80000000;
  fVar15 = ipoint->scale;
  local_98 = ZEXT416((uint)fVar15);
  auVar11 = vpternlogd_avx512vl(auVar13,local_98,auVar16,0xf8);
  auVar11 = ZEXT416((uint)(fVar15 + auVar11._0_4_));
  auVar11 = vroundss_avx(auVar11,auVar11,0xb);
  scale = (int)auVar11._0_4_;
  local_a8 = -0.08 / (fVar15 * fVar15);
  auVar12 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)ipoint->y),auVar16,0xf8);
  auVar11 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)ipoint->x),auVar16,0xf8);
  auVar33._0_8_ = (double)fVar15;
  auVar33._8_8_ = 0;
  auVar11 = ZEXT416((uint)(ipoint->x + auVar11._0_4_));
  auVar11 = vroundss_avx(auVar11,auVar11,0xb);
  auVar14._0_8_ = (double)auVar11._0_4_;
  auVar14._8_8_ = auVar11._8_8_;
  auVar16 = vfmadd231sd_fma(auVar14,auVar33,ZEXT816(0x3fe0000000000000));
  auVar11 = ZEXT416((uint)(ipoint->y + auVar12._0_4_));
  auVar11 = vroundss_avx(auVar11,auVar11,0xb);
  auVar12._0_8_ = (double)auVar11._0_4_;
  auVar12._8_8_ = auVar11._8_8_;
  auVar11 = vfmadd231sd_fma(auVar12,auVar33,ZEXT816(0x3fe0000000000000));
  auVar25 = ZEXT864(0) << 0x20;
  iVar10 = 0;
  local_c8 = 0;
  iVar9 = -8;
  fVar15 = -2.5;
  local_a0 = ipoint;
  while (iVar9 < 8) {
    local_bc = fVar15 + 1.0;
    auVar32._0_4_ = (float)iVar9;
    auVar32._4_12_ = in_register_00001384;
    local_c8 = (long)(int)local_c8;
    local_b4 = local_bc * local_bc;
    auVar12 = vfmadd132ss_fma(auVar32,ZEXT416((uint)(float)auVar16._0_8_),
                              ZEXT416((uint)local_98._0_4_));
    auVar26._8_4_ = 0x3effffff;
    auVar26._0_8_ = 0x3effffff3effffff;
    auVar26._12_4_ = 0x3effffff;
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    auVar13 = vpternlogd_avx512vl(auVar26,auVar12,auVar1,0xf8);
    auVar12 = ZEXT416((uint)(auVar12._0_4_ + auVar13._0_4_));
    auVar12 = vroundss_avx(auVar12,auVar12,0xb);
    auVar27._0_4_ = (int)auVar12._0_4_;
    auVar27._4_4_ = (int)auVar12._4_4_;
    auVar27._8_4_ = (int)auVar12._8_4_;
    auVar27._12_4_ = (int)auVar12._12_4_;
    local_58 = vcvtdq2ps_avx(auVar27);
    local_d8 = -3;
    uVar8 = 0xfffffff8;
    local_e0 = -2.5;
    local_b8 = iVar9;
    while (iVar9 = (int)uVar8, iVar9 < 8) {
      local_b0 = auVar25._0_4_;
      iVar6 = iVar9 + -4;
      local_e0 = local_e0 + 1.0;
      auVar17._0_4_ = (float)iVar9;
      auVar17._4_12_ = in_register_00001384;
      auVar12 = vfmadd132ss_fma(auVar17,ZEXT416((uint)(float)auVar11._0_8_),
                                ZEXT416((uint)local_98._0_4_));
      auVar28._8_4_ = 0x3effffff;
      auVar28._0_8_ = 0x3effffff3effffff;
      auVar28._12_4_ = 0x3effffff;
      auVar2._8_4_ = 0x80000000;
      auVar2._0_8_ = 0x8000000080000000;
      auVar2._12_4_ = 0x80000000;
      auVar13 = vpternlogd_avx512vl(auVar28,auVar12,auVar2,0xf8);
      auVar12 = ZEXT416((uint)(auVar12._0_4_ + auVar13._0_4_));
      auVar12 = vroundss_avx(auVar12,auVar12,0xb);
      auVar18._0_4_ = (int)auVar12._0_4_;
      auVar18._4_4_ = (int)auVar12._4_4_;
      auVar18._8_4_ = (int)auVar12._8_4_;
      auVar18._12_4_ = (int)auVar12._12_4_;
      local_68 = vcvtdq2ps_avx(auVar18);
      _local_88 = ZEXT816(0) << 0x20;
      local_70 = uVar8;
      while (iVar6 != local_d8) {
        auVar19._0_4_ = (float)iVar6;
        auVar19._4_12_ = in_register_00001384;
        auVar12 = vfmadd132ss_fma(auVar19,ZEXT416((uint)(float)auVar11._0_8_),
                                  ZEXT416((uint)local_98._0_4_));
        auVar29._8_4_ = 0x3effffff;
        auVar29._0_8_ = 0x3effffff3effffff;
        auVar29._12_4_ = 0x3effffff;
        auVar3._8_4_ = 0x80000000;
        auVar3._0_8_ = 0x8000000080000000;
        auVar3._12_4_ = 0x80000000;
        auVar13 = vpternlogd_avx512vl(auVar29,auVar12,auVar3,0xf8);
        auVar12 = ZEXT416((uint)(auVar12._0_4_ + auVar13._0_4_));
        auVar13 = vroundss_avx(auVar12,auVar12,0xb);
        auVar20._0_4_ = (int)auVar13._0_4_;
        auVar20._4_4_ = (int)auVar13._4_4_;
        auVar20._8_4_ = (int)auVar13._8_4_;
        auVar20._12_4_ = (int)auVar13._12_4_;
        auVar12 = vcvtdq2ps_avx(auVar20);
        local_a4 = (float)local_68._0_4_ - auVar12._0_4_;
        local_a4 = local_a4 * local_a4;
        iVar9 = -0xc;
        local_ac = iVar6;
        while (iVar9 != -3) {
          auVar21._0_4_ = (float)(iVar10 + iVar9);
          auVar21._4_12_ = in_register_00001384;
          auVar12 = vfmadd132ss_fma(auVar21,ZEXT416((uint)(float)auVar16._0_8_),
                                    ZEXT416((uint)local_98._0_4_));
          auVar30._8_4_ = 0x3effffff;
          auVar30._0_8_ = 0x3effffff3effffff;
          auVar30._12_4_ = 0x3effffff;
          auVar4._8_4_ = 0x80000000;
          auVar4._0_8_ = 0x8000000080000000;
          auVar4._12_4_ = 0x80000000;
          auVar14 = vpternlogd_avx512vl(auVar30,auVar12,auVar4,0xf8);
          auVar12 = ZEXT416((uint)(auVar12._0_4_ + auVar14._0_4_));
          auVar14 = vroundss_avx(auVar12,auVar12,0xb);
          auVar22._0_4_ = (int)auVar14._0_4_;
          auVar22._4_4_ = (int)auVar14._4_4_;
          auVar22._8_4_ = (int)auVar14._8_4_;
          auVar22._12_4_ = (int)auVar14._12_4_;
          auVar12 = vcvtdq2ps_avx(auVar22);
          fVar15 = (float)local_58._0_4_ - auVar12._0_4_;
          local_48 = expf((fVar15 * fVar15 + local_a4) * local_a8);
          rx = 0.0;
          ry = 0.0;
          haarXY(iimage,(int)auVar13._0_4_ - scale,(int)auVar14._0_4_ - scale,scale,&rx,&ry);
          iVar9 = iVar9 + 1;
          auVar12 = vinsertps_avx(ZEXT416((uint)ry),ZEXT416((uint)rx),0x10);
          auVar23._0_4_ = local_48 * auVar12._0_4_;
          auVar23._4_4_ = local_48 * auVar12._4_4_;
          auVar23._8_4_ = local_48 * auVar12._8_4_;
          auVar23._12_4_ = local_48 * auVar12._12_4_;
          auVar5._8_4_ = 0x7fffffff;
          auVar5._0_8_ = 0x7fffffff7fffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar12 = vandps_avx512vl(auVar23,auVar5);
          auVar12 = vmovlhps_avx(auVar23,auVar12);
          local_88._4_4_ = (float)local_88._4_4_ + auVar12._4_4_;
          local_88._0_4_ = (float)local_88._0_4_ + auVar12._0_4_;
          fStack_80 = fStack_80 + auVar12._8_4_;
          fStack_7c = fStack_7c + auVar12._12_4_;
        }
        iVar6 = local_ac + 1;
      }
      uVar8 = (ulong)((int)local_70 + 5);
      fVar15 = expf((local_e0 * local_e0 + local_b4) * -0.22222222);
      auVar24._0_4_ = fVar15 * (float)local_88._0_4_;
      auVar24._4_4_ = fVar15 * (float)local_88._4_4_;
      auVar24._8_4_ = fVar15 * fStack_80;
      auVar24._12_4_ = fVar15 * fStack_7c;
      local_d8 = local_d8 + 5;
      auVar31._0_4_ = auVar24._0_4_ * auVar24._0_4_;
      auVar31._4_4_ = auVar24._4_4_ * auVar24._4_4_;
      auVar31._8_4_ = auVar24._8_4_ * auVar24._8_4_;
      auVar31._12_4_ = auVar24._12_4_ * auVar24._12_4_;
      auVar13 = vshufpd_avx(auVar24,auVar24,1);
      *(undefined1 (*) [16])(local_a0->descriptor + local_c8) = auVar24;
      local_c8 = local_c8 + 4;
      auVar12 = vmovshdup_avx(auVar31);
      auVar12 = vfmadd231ss_fma(auVar12,auVar24,auVar24);
      auVar13 = vfmadd213ss_fma(auVar13,auVar13,auVar12);
      auVar12 = vshufps_avx(auVar24,auVar24,0xff);
      auVar12 = vfmadd213ss_fma(auVar12,auVar12,auVar13);
      auVar25 = ZEXT464((uint)(local_b0 + auVar12._0_4_));
    }
    iVar10 = iVar10 + 5;
    fVar15 = local_bc;
    iVar9 = local_b8 + 5;
  }
  if (auVar25._0_4_ < 0.0) {
    fVar15 = sqrtf(auVar25._0_4_);
  }
  else {
    auVar11 = vsqrtss_avx(auVar25._0_16_,auVar25._0_16_);
    fVar15 = auVar11._0_4_;
  }
  for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
    local_a0->descriptor[lVar7] = (1.0 / fVar15) * local_a0->descriptor[lVar7];
  }
  return;
}

Assistant:

void get_msurf_descriptor_inlinedHaarWavelets(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_inlined
        - using haarXY function to compute Haar Wavelet responses at once
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                int sample_y_sub_int_scale = sample_y-int_scale;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    //Get the gaussian weighted x and y responses
                    // NOTE: We use expf here
                    float gauss_s1 = expf(g1_factor * (xs_sub_sample_x_squared + ys_sub_sample_y_squared));
                    
                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    // printf("sample_x,y:%i %i int_scale:%i rx:%f ry:%f\n",sample_x_sub_int_scale,sample_y_sub_int_scale, int_scale, rx,ry);

                    // float rx = haarX_improved(iimage, sample_y, sample_x, int_scale*2);
                    // float ry = haarY_improved(iimage, sample_y, sample_x, int_scale*2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            // NOTE: We use expf here
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}